

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O2

bool EncrStream_BlockRead
               (TEncryptedStream *pStream,ULONGLONG StartOffset,ULONGLONG EndOffset,
               LPBYTE BlockBuffer,DWORD BytesNeeded,bool bAvailable)

{
  bool bVar1;
  DWORD DVar2;
  ULONGLONG local_28;
  
  local_28 = StartOffset;
  if (((pStream->super_TBlockStream).BlockSize - 1 & (uint)StartOffset) != 0) {
    __assert_fail("(StartOffset & (pStream->BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x81a,
                  "bool EncrStream_BlockRead(TEncryptedStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if (StartOffset < EndOffset) {
    if (bAvailable) {
      DVar2 = (int)EndOffset - (uint)StartOffset;
      bVar1 = (*(pStream->super_TBlockStream).super_TFileStream.BaseRead)
                        ((TFileStream *)pStream,&local_28,BlockBuffer,DVar2);
      if (bVar1) {
        DecryptFileChunk((DWORD *)BlockBuffer,&(pStream->super_TBlockStream).field_0xfc,local_28,
                         DVar2 + 0x3f & 0xffffffc0);
      }
      return bVar1;
    }
    __assert_fail("bAvailable != false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x81c,
                  "bool EncrStream_BlockRead(TEncryptedStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  __assert_fail("StartOffset < EndOffset",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                ,0x81b,
                "bool EncrStream_BlockRead(TEncryptedStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
               );
}

Assistant:

static bool EncrStream_BlockRead(
    TEncryptedStream * pStream,
    ULONGLONG StartOffset,
    ULONGLONG EndOffset,
    LPBYTE BlockBuffer,
    DWORD BytesNeeded,
    bool bAvailable)
{
    DWORD dwBytesToRead;

    assert((StartOffset & (pStream->BlockSize - 1)) == 0);
    assert(StartOffset < EndOffset);
    assert(bAvailable != false);
    BytesNeeded = BytesNeeded;
    bAvailable = bAvailable;

    // Read the file from the stream as-is
    // Limit the reading to number of blocks really needed
    dwBytesToRead = (DWORD)(EndOffset - StartOffset);
    if(!pStream->BaseRead(pStream, &StartOffset, BlockBuffer, dwBytesToRead))
        return false;

    // Decrypt the data
    dwBytesToRead = (dwBytesToRead + ENCRYPTED_CHUNK_SIZE - 1) & ~(ENCRYPTED_CHUNK_SIZE - 1);
    DecryptFileChunk((PDWORD)BlockBuffer, pStream->Key, StartOffset, dwBytesToRead);
    return true;
}